

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_affinity.h
# Opt level: O0

Address * __thiscall Address::operator=(Address *this,Address *b)

{
  uint i;
  Address *b_local;
  Address *this_local;
  
  this->depth = b->depth;
  for (i = 0; i < this->depth; i = i + 1) {
    this->labels[i] = b->labels[i];
    this->childNums[i] = b->childNums[i];
  }
  this->leader = 0;
  return this;
}

Assistant:

Address &operator=(const Address &b) {
    depth = b.depth;
    for (unsigned i = 0; i < depth; i++) {
      labels[i] = b.labels[i];
      childNums[i] = b.childNums[i];
    }
    leader = FALSE;
    return *this;
  }